

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

int Fraig_HashTableLookupS
              (Fraig_Man_t *pMan,Fraig_Node_t *p1,Fraig_Node_t *p2,Fraig_Node_t **ppNodeRes)

{
  Fraig_HashTable_t *p_00;
  ulong uVar1;
  Fraig_Node_t *pFVar2;
  uint local_44;
  Fraig_Node_t *pFStack_40;
  uint Key;
  Fraig_Node_t *pEnt;
  Fraig_HashTable_t *p;
  Fraig_Node_t **ppNodeRes_local;
  Fraig_Node_t *p2_local;
  Fraig_Node_t *p1_local;
  Fraig_Man_t *pMan_local;
  
  p_00 = pMan->pTableS;
  ppNodeRes_local = (Fraig_Node_t **)p2;
  p2_local = p1;
  if (*(int *)((ulong)p2 & 0xfffffffffffffffe) < *(int *)((ulong)p1 & 0xfffffffffffffffe)) {
    ppNodeRes_local = (Fraig_Node_t **)p1;
    p2_local = p2;
  }
  uVar1 = (ulong)((long)p2_local + (long)ppNodeRes_local * 0xc00005) % (ulong)(long)p_00->nBins;
  local_44 = (uint)uVar1;
  pFStack_40 = p_00->pBins[uVar1 & 0xffffffff];
  while( true ) {
    if (pFStack_40 == (Fraig_Node_t *)0x0) {
      if (SBORROW4(p_00->nEntries,p_00->nBins * 2) == p_00->nEntries + p_00->nBins * -2 < 0) {
        Fraig_TableResizeS(p_00);
        local_44 = (uint)((ulong)((long)p2_local + (long)ppNodeRes_local * 0xc00005) %
                         (ulong)(long)p_00->nBins);
      }
      pFVar2 = Fraig_NodeCreate(pMan,p2_local,(Fraig_Node_t *)ppNodeRes_local);
      pFVar2->pNextS = p_00->pBins[local_44];
      p_00->pBins[local_44] = pFVar2;
      *ppNodeRes = pFVar2;
      p_00->nEntries = p_00->nEntries + 1;
      return 0;
    }
    if ((pFStack_40->p1 == p2_local) && (pFStack_40->p2 == (Fraig_Node_t *)ppNodeRes_local)) break;
    pFStack_40 = pFStack_40->pNextS;
  }
  *ppNodeRes = pFStack_40;
  return 1;
}

Assistant:

int Fraig_HashTableLookupS( Fraig_Man_t * pMan, Fraig_Node_t * p1, Fraig_Node_t * p2, Fraig_Node_t ** ppNodeRes )
{
    Fraig_HashTable_t * p = pMan->pTableS;
    Fraig_Node_t * pEnt;
    unsigned Key;

    // order the arguments
    if ( Fraig_Regular(p1)->Num > Fraig_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Fraig_HashKey2( p1, p2, p->nBins );
    Fraig_TableBinForEachEntryS( p->pBins[Key], pEnt )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
        {
            *ppNodeRes = pEnt;
            return 1;
        }
    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeS( p );
        Key = Fraig_HashKey2( p1, p2, p->nBins );
    }
    // create the new node
    pEnt = Fraig_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNextS = p->pBins[Key];
    p->pBins[Key] = pEnt;
    *ppNodeRes = pEnt;
    p->nEntries++;
    return 0;
}